

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts div_floats(FloatParts a,FloatParts b,float_status *s)

{
  FloatParts a_00;
  ulong uVar1;
  _Bool _Var2;
  uint64_t uVar3;
  ulong uVar4;
  FloatParts FVar5;
  int local_6c;
  uint64_t uStack_68;
  int exp;
  uint64_t r;
  uint64_t q;
  uint64_t n1;
  uint64_t n0;
  float_status *pfStack_40;
  _Bool sign;
  float_status *s_local;
  FloatParts b_local;
  FloatParts a_local;
  ulong local_10;
  
  s_local = (float_status *)b.frac;
  b_local._8_8_ = a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_1_ = a.cls;
  a_local.frac._5_1_ = a.sign;
  a_local.frac._6_2_ = a._14_2_;
  b_local.frac._0_4_ = b.exp;
  b_local.frac._4_1_ = b.cls;
  b_local.frac._5_1_ = b.sign;
  b_local.frac._6_2_ = b._14_2_;
  n0._7_1_ = (a_local.frac._5_1_ & 1U) != (b_local.frac._5_1_ & 1);
  pfStack_40 = s;
  if ((a_local.frac._4_1_ == float_class_normal) && (b_local.frac._4_1_ == float_class_normal)) {
    local_6c = (int)a_local.frac - (int)b_local.frac;
    if ((ulong)b_local._8_8_ < s_local) {
      local_6c = local_6c + -1;
      shift128Left(0,b_local._8_8_,0x40,&q,&n1);
    }
    else {
      shift128Left(0,b_local._8_8_,0x3f,&q,&n1);
    }
    uVar3 = udiv_qrnnd(&stack0xffffffffffffff98,q,n1,(long)s_local << 1);
    uVar4 = uVar3 | (long)(int)(uint)(uStack_68 != 0);
    uVar1 = CONCAT26(a_local.frac._6_2_,CONCAT15(n0._7_1_,CONCAT14(2,local_6c))) &
            0xffff01ffffffffff;
    local_10._0_4_ = (int)uVar1;
    local_10._4_1_ = (char)(uVar1 >> 0x20);
    local_10._5_1_ = (_Bool)(char)(uVar1 >> 0x28);
    local_10._6_2_ = (short)(uVar1 >> 0x30);
    a_local.exp = (int)uVar4;
    a_local.cls = (char)(uVar4 >> 0x20);
    a_local.sign = (_Bool)(char)(uVar4 >> 0x28);
    a_local._14_2_ = (short)(uVar4 >> 0x30);
  }
  else {
    _Var2 = is_nan(a_local.frac._4_1_);
    if ((!_Var2) && (_Var2 = is_nan(b_local.frac._4_1_), !_Var2)) {
      if ((a_local.frac._4_1_ == b_local.frac._4_1_) &&
         ((a_local.frac._4_1_ == float_class_inf || (a_local.frac._4_1_ == float_class_zero)))) {
        pfStack_40->float_exception_flags = pfStack_40->float_exception_flags | 1;
        FVar5 = parts_default_nan(pfStack_40);
        return FVar5;
      }
      if ((a_local.frac._4_1_ == float_class_inf) || (a_local.frac._4_1_ == float_class_zero)) {
        uVar1 = CONCAT26(a_local.frac._6_2_,CONCAT15(n0._7_1_,a._8_5_)) & 0xffff01ffffffffff;
        local_10._0_4_ = (int)uVar1;
        local_10._4_1_ = (char)(uVar1 >> 0x20);
        local_10._5_1_ = (_Bool)(char)(uVar1 >> 0x28);
        local_10._6_2_ = (short)(uVar1 >> 0x30);
        a_local.exp = b_local.exp;
        a_local.cls = b_local.cls;
        a_local.sign = b_local.sign;
        a_local._14_2_ = b_local._14_2_;
        return stack0xffffffffffffffe8;
      }
      if (b_local.frac._4_1_ == float_class_zero) {
        pfStack_40->float_exception_flags = pfStack_40->float_exception_flags | 4;
        uVar1 = CONCAT26(a_local.frac._6_2_,CONCAT15(n0._7_1_,CONCAT14(3,(int)a_local.frac))) &
                0xffff01ffffffffff;
        local_10._0_4_ = (int)uVar1;
        local_10._4_1_ = (char)(uVar1 >> 0x20);
        local_10._5_1_ = (_Bool)(char)(uVar1 >> 0x28);
        local_10._6_2_ = (short)(uVar1 >> 0x30);
        a_local.exp = b_local.exp;
        a_local.cls = b_local.cls;
        a_local.sign = b_local.sign;
        a_local._14_2_ = b_local._14_2_;
        return stack0xffffffffffffffe8;
      }
      if (b_local.frac._4_1_ == float_class_inf) {
        uVar1 = CONCAT26(a_local.frac._6_2_,CONCAT15(n0._7_1_,CONCAT14(1,(int)a_local.frac))) &
                0xffff01ffffffffff;
        local_10._0_4_ = (int)uVar1;
        local_10._4_1_ = (char)(uVar1 >> 0x20);
        local_10._5_1_ = (_Bool)(char)(uVar1 >> 0x28);
        local_10._6_2_ = (short)(uVar1 >> 0x30);
        a_local.exp = b_local.exp;
        a_local.cls = b_local.cls;
        a_local.sign = b_local.sign;
        a_local._14_2_ = b_local._14_2_;
        return stack0xffffffffffffffe8;
      }
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x702,(char *)0x0);
    }
    a_00.exp = (int)a_local.frac;
    a_00.frac._0_4_ = b_local.exp;
    a_00.frac._4_1_ = b_local.cls;
    a_00.frac._5_1_ = b_local.sign;
    a_00.frac._6_2_ = b_local._14_2_;
    a_00.cls = a_local.frac._4_1_;
    a_00.sign = a_local.frac._5_1_;
    a_00._14_2_ = a_local.frac._6_2_;
    FVar5.exp = (int)b_local.frac;
    FVar5.frac = (uint64_t)s_local;
    FVar5.cls = b_local.frac._4_1_;
    FVar5.sign = (_Bool)b_local.frac._5_1_;
    FVar5._14_2_ = b_local.frac._6_2_;
    join_0x00000010_0x00000000_ = pick_nan(a_00,FVar5,pfStack_40);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts div_floats(FloatParts a, FloatParts b, float_status *s)
{
    bool sign = a.sign ^ b.sign;

    if (a.cls == float_class_normal && b.cls == float_class_normal) {
        uint64_t n0, n1, q, r;
        int exp = a.exp - b.exp;

        /*
         * We want a 2*N / N-bit division to produce exactly an N-bit
         * result, so that we do not lose any precision and so that we
         * do not have to renormalize afterward.  If A.frac < B.frac,
         * then division would produce an (N-1)-bit result; shift A left
         * by one to produce the an N-bit result, and decrement the
         * exponent to match.
         *
         * The udiv_qrnnd algorithm that we're using requires normalization,
         * i.e. the msb of the denominator must be set.  Since we know that
         * DECOMPOSED_BINARY_POINT is msb-1, the inputs must be shifted left
         * by one (more), and the remainder must be shifted right by one.
         */
        if (a.frac < b.frac) {
            exp -= 1;
            shift128Left(0, a.frac, DECOMPOSED_BINARY_POINT + 2, &n1, &n0);
        } else {
            shift128Left(0, a.frac, DECOMPOSED_BINARY_POINT + 1, &n1, &n0);
        }
        q = udiv_qrnnd(&r, n1, n0, b.frac << 1);

        /*
         * Set lsb if there is a remainder, to set inexact.
         * As mentioned above, to find the actual value of the remainder we
         * would need to shift right, but (1) we are only concerned about
         * non-zero-ness, and (2) the remainder will always be even because
         * both inputs to the division primitive are even.
         */
        a.frac = q | (r != 0);
        a.sign = sign;
        a.exp = exp;
        return a;
    }
    /* handle all the NaN cases */
    if (is_nan(a.cls) || is_nan(b.cls)) {
        return pick_nan(a, b, s);
    }
    /* 0/0 or Inf/Inf */
    if (a.cls == b.cls
        &&
        (a.cls == float_class_inf || a.cls == float_class_zero)) {
        s->float_exception_flags |= float_flag_invalid;
        return parts_default_nan(s);
    }
    /* Inf / x or 0 / x */
    if (a.cls == float_class_inf || a.cls == float_class_zero) {
        a.sign = sign;
        return a;
    }
    /* Div 0 => Inf */
    if (b.cls == float_class_zero) {
        s->float_exception_flags |= float_flag_divbyzero;
        a.cls = float_class_inf;
        a.sign = sign;
        return a;
    }
    /* Div by Inf */
    if (b.cls == float_class_inf) {
        a.cls = float_class_zero;
        a.sign = sign;
        return a;
    }

    g_assert_not_reached();
    return a;
}